

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

string * __thiscall
pfederc::Lexer::getLineFromIndex_abi_cxx11_(string *__return_storage_ptr__,Lexer *this,size_t index)

{
  ulong uVar1;
  size_t __n;
  const_reference pvVar2;
  size_type sVar3;
  char *pcVar4;
  ulong local_c0;
  size_t lineEndIndex;
  size_t lineStartIndex;
  size_t lineIndex;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  size_t local_20;
  size_t index_local;
  Lexer *this_local;
  string *result;
  
  local_20 = index;
  index_local = (size_t)this;
  this_local = (Lexer *)__return_storage_ptr__;
  if (this->currentEndIndex < index) {
    std::__cxx11::to_string(&local_60,index);
    std::operator+(&local_40,"Out of bounds: ",&local_60);
    fatal("lexer.cpp",0x1c,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)((long)&lineIndex + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&lineIndex + 7));
  }
  else {
    __n = getLineNumber(this,index);
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->lineIndices,__n);
    uVar1 = *pvVar2;
    sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->lineIndices);
    if (__n == sVar3 - 1) {
      local_c0 = this->currentEndIndex;
    }
    else {
      pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->lineIndices,__n + 1);
      local_c0 = *pvVar2 - 1;
    }
    if ((uVar1 < local_c0) &&
       (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&this->fileContent),
       *pcVar4 != '\r')) {
      std::__cxx11::string::operator[]((ulong)&this->fileContent);
    }
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&this->fileContent);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Lexer::getLineFromIndex(size_t index) const noexcept {
  if (index > currentEndIndex) {
    fatal("lexer.cpp", __LINE__, "Out of bounds: " + std::to_string(index));
    return "";
  }

  size_t lineIndex = getLineNumber(index);

  size_t lineStartIndex = lineIndices[lineIndex];
  size_t lineEndIndex = lineIndex == lineIndices.size() - 1
    ? currentEndIndex : lineIndices[lineIndex + 1] - 1;
  if (lineEndIndex > lineStartIndex
        && (fileContent[lineEndIndex] == '\r'
          || fileContent[lineEndIndex] == '\n')) {
    --lineEndIndex;
  }

  std::string result(fileContent.substr(lineStartIndex,
    lineEndIndex - lineStartIndex));
  return result;
}